

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Vgm_Emu::track_info_(Vgm_Emu *this,track_info_t *out,int param_2)

{
  undefined8 in_RAX;
  byte_ *pbVar1;
  int size;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  get_vgm_length((header_t *)(this->super_Vgm_Emu_Impl).data,out);
  pbVar1 = gd3_data(this,&local_14);
  if (pbVar1 != (byte_ *)0x0) {
    parse_gd3(pbVar1 + 0xc,pbVar1 + local_14,out);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Vgm_Emu::track_info_( track_info_t* out, int ) const
{
	get_vgm_length( header(), out );
	
	int size;
	byte const* gd3 = gd3_data( &size );
	if ( gd3 )
		parse_gd3( gd3 + gd3_header_size, gd3 + size, out );
	
	return 0;
}